

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::UninterpretedOption::MergeFrom
          (UninterpretedOption *this,UninterpretedOption *from)

{
  int *piVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  UninterpretedOption_NamePart *from_00;
  void **ppvVar5;
  uint64 uVar6;
  int64 iVar7;
  LogMessage *other;
  UninterpretedOption_NamePart *this_00;
  string *psVar8;
  long lVar9;
  LogFinisher local_61;
  LogMessage local_60;
  
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.pb.cc"
               ,0x1d1f);
    other = internal::LogMessage::operator<<(&local_60,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_61,other);
    internal::LogMessage::~LogMessage(&local_60);
  }
  internal::RepeatedPtrFieldBase::Reserve
            (&(this->name_).super_RepeatedPtrFieldBase,
             (from->name_).super_RepeatedPtrFieldBase.current_size_ +
             (this->name_).super_RepeatedPtrFieldBase.current_size_);
  if (0 < (from->name_).super_RepeatedPtrFieldBase.current_size_) {
    lVar9 = 0;
    do {
      from_00 = (UninterpretedOption_NamePart *)
                (from->name_).super_RepeatedPtrFieldBase.elements_[lVar9];
      iVar3 = (this->name_).super_RepeatedPtrFieldBase.current_size_;
      iVar4 = (this->name_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar3 < iVar4) {
        ppvVar5 = (this->name_).super_RepeatedPtrFieldBase.elements_;
        (this->name_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
        this_00 = (UninterpretedOption_NamePart *)ppvVar5[iVar3];
      }
      else {
        iVar3 = (this->name_).super_RepeatedPtrFieldBase.total_size_;
        if (iVar4 == iVar3) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&(this->name_).super_RepeatedPtrFieldBase,iVar3 + 1);
        }
        piVar1 = &(this->name_).super_RepeatedPtrFieldBase.allocated_size_;
        *piVar1 = *piVar1 + 1;
        this_00 = internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>::New
                            ();
        ppvVar5 = (this->name_).super_RepeatedPtrFieldBase.elements_;
        iVar3 = (this->name_).super_RepeatedPtrFieldBase.current_size_;
        (this->name_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
        ppvVar5[iVar3] = this_00;
      }
      UninterpretedOption_NamePart::MergeFrom(this_00,from_00);
      lVar9 = lVar9 + 1;
    } while (lVar9 < (from->name_).super_RepeatedPtrFieldBase.current_size_);
  }
  if ((from->_has_bits_[0] & 0x1fe) != 0) {
    if ((from->_has_bits_[0] & 2) != 0) {
      this->_has_bits_[0] = this->_has_bits_[0] | 2;
      if (this->identifier_value_ == (string *)internal::kEmptyString_abi_cxx11_) {
        psVar8 = (string *)operator_new(0x20);
        (psVar8->_M_dataplus)._M_p = (pointer)&psVar8->field_2;
        psVar8->_M_string_length = 0;
        (psVar8->field_2)._M_local_buf[0] = '\0';
        this->identifier_value_ = psVar8;
      }
      std::__cxx11::string::_M_assign((string *)this->identifier_value_);
    }
    if ((from->_has_bits_[0] & 4) != 0) {
      uVar6 = from->positive_int_value_;
      this->_has_bits_[0] = this->_has_bits_[0] | 4;
      this->positive_int_value_ = uVar6;
    }
    if ((from->_has_bits_[0] & 8) != 0) {
      iVar7 = from->negative_int_value_;
      this->_has_bits_[0] = this->_has_bits_[0] | 8;
      this->negative_int_value_ = iVar7;
    }
    if ((from->_has_bits_[0] & 0x10) != 0) {
      dVar2 = from->double_value_;
      this->_has_bits_[0] = this->_has_bits_[0] | 0x10;
      this->double_value_ = dVar2;
    }
    if ((from->_has_bits_[0] & 0x20) != 0) {
      this->_has_bits_[0] = this->_has_bits_[0] | 0x20;
      if (this->string_value_ == (string *)internal::kEmptyString_abi_cxx11_) {
        psVar8 = (string *)operator_new(0x20);
        (psVar8->_M_dataplus)._M_p = (pointer)&psVar8->field_2;
        psVar8->_M_string_length = 0;
        (psVar8->field_2)._M_local_buf[0] = '\0';
        this->string_value_ = psVar8;
      }
      std::__cxx11::string::_M_assign((string *)this->string_value_);
    }
    if ((from->_has_bits_[0] & 0x40) != 0) {
      this->_has_bits_[0] = this->_has_bits_[0] | 0x40;
      if (this->aggregate_value_ == (string *)internal::kEmptyString_abi_cxx11_) {
        psVar8 = (string *)operator_new(0x20);
        (psVar8->_M_dataplus)._M_p = (pointer)&psVar8->field_2;
        psVar8->_M_string_length = 0;
        (psVar8->field_2)._M_local_buf[0] = '\0';
        this->aggregate_value_ = psVar8;
      }
      std::__cxx11::string::_M_assign((string *)this->aggregate_value_);
    }
  }
  UnknownFieldSet::MergeFrom(&this->_unknown_fields_,&from->_unknown_fields_);
  return;
}

Assistant:

void UninterpretedOption::MergeFrom(const UninterpretedOption& from) {
  GOOGLE_CHECK_NE(&from, this);
  name_.MergeFrom(from.name_);
  if (from._has_bits_[1 / 32] & (0xffu << (1 % 32))) {
    if (from.has_identifier_value()) {
      set_identifier_value(from.identifier_value());
    }
    if (from.has_positive_int_value()) {
      set_positive_int_value(from.positive_int_value());
    }
    if (from.has_negative_int_value()) {
      set_negative_int_value(from.negative_int_value());
    }
    if (from.has_double_value()) {
      set_double_value(from.double_value());
    }
    if (from.has_string_value()) {
      set_string_value(from.string_value());
    }
    if (from.has_aggregate_value()) {
      set_aggregate_value(from.aggregate_value());
    }
  }
  mutable_unknown_fields()->MergeFrom(from.unknown_fields());
}